

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosCommMPI.cpp
# Opt level: O2

int __thiscall
adios2::helper::CommImplMPI::Win_lock
          (CommImplMPI *this,LockType lock_type,int rank,int assert,Win *win,string *hint)

{
  int value;
  undefined8 uVar1;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  uVar1 = adios2::helper::CommWinImpl::Get(win);
  lVar2 = __dynamic_cast(uVar1,&CommWinImpl::typeinfo,&CommWinImplMPI::typeinfo,0);
  value = MPI_Win_lock(*(undefined4 *)
                        ((long)&(anonymous_namespace)::LockTypeToMPI + (long)(int)lock_type * 4),
                       rank,assert,*(undefined8 *)(lVar2 + 8));
  std::operator+(&local_40,"in call to Win_Lock ",hint);
  std::operator+(&local_60,&local_40,"\n");
  anon_unknown_1::CheckMPIReturn(value,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return value;
}

Assistant:

int CommImplMPI::Win_lock(Comm::LockType lock_type, int rank, int assert, Comm::Win &win,
                          const std::string &hint) const
{
    CommWinImplMPI *w = dynamic_cast<CommWinImplMPI *>(CommWinImpl::Get(win));
    int mpi_lock_type = ToMPI(lock_type);
    int ret = MPI_Win_lock(mpi_lock_type, rank, assert, w->m_Win);
    CheckMPIReturn(ret, "in call to Win_Lock " + hint + "\n");
    return ret;
}